

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qmdisubwindow.cpp
# Opt level: O3

void QMdiSubWindow::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  long lVar2;
  undefined8 *puVar3;
  undefined4 uVar4;
  long in_FS_OFFSET;
  undefined4 local_30;
  undefined4 local_2c;
  void *local_28;
  undefined4 *local_20;
  undefined4 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      local_2c = *_a[1];
      local_30 = *_a[2];
      local_20 = &local_2c;
      local_18 = &local_30;
      local_28 = (void *)0x0;
      QMetaObject::activate(_o,&staticMetaObject,0,&local_28);
      goto switchD_00452929_caseD_3;
    case 1:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        QMetaObject::activate(_o,&staticMetaObject,1,(void **)0x0);
        return;
      }
      break;
    case 2:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        showSystemMenu((QMdiSubWindow *)_o);
        return;
      }
      break;
    case 3:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        showShaded((QMdiSubWindow *)_o);
        return;
      }
      break;
    case 4:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        QMdiSubWindowPrivate::_q_updateStaysOnTopHint(*(QMdiSubWindowPrivate **)(_o + 8));
        return;
      }
      break;
    case 5:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        QMdiSubWindowPrivate::_q_enterInteractiveMode(*(QMdiSubWindowPrivate **)(_o + 8));
        return;
      }
      break;
    case 6:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        QMdiSubWindowPrivate::_q_processFocusChanged
                  (*(QMdiSubWindowPrivate **)(_o + 8),
                   (QWidget *)&switchD_00452929::switchdataD_006da9c0,*_a[2]);
        return;
      }
      break;
    default:
      goto switchD_00452929_caseD_3;
    }
    goto LAB_00452b25;
  case ReadProperty:
    if (_id == 1) {
      uVar4 = *(undefined4 *)(*(long *)(_o + 8) + 0x2e4);
    }
    else {
      if (_id != 0) break;
      uVar4 = *(undefined4 *)(*(long *)(_o + 8) + 0x2e0);
    }
    *(undefined4 *)*_a = uVar4;
    break;
  case WriteProperty:
    if (_id == 1) {
      *(undefined4 *)(*(long *)(_o + 8) + 0x2e4) = **_a;
    }
    else if (_id == 0) {
      *(undefined4 *)(*(long *)(_o + 8) + 0x2e0) = **_a;
    }
    break;
  case IndexOfMethod:
    pcVar1 = *_a[1];
    lVar2 = *(long *)((long)_a[1] + 8);
    if (pcVar1 == windowStateChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar1 == aboutToActivate && lVar2 == 0) {
      *(undefined4 *)*_a = 1;
    }
    break;
  case RegisterMethodArgumentMetaType:
    if (_id == 6) {
      puVar3 = (undefined8 *)*_a;
      if (*_a[1] < 2) {
        *puVar3 = &QtPrivate::QMetaTypeInterfaceWrapper<QWidget_*>::metaType;
        break;
      }
    }
    else {
      puVar3 = (undefined8 *)*_a;
    }
    *puVar3 = 0;
  }
switchD_00452929_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
LAB_00452b25:
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindow::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QMdiSubWindow *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->windowStateChanged((*reinterpret_cast< std::add_pointer_t<Qt::WindowStates>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<Qt::WindowStates>>(_a[2]))); break;
        case 1: _t->aboutToActivate(); break;
        case 2: _t->showSystemMenu(); break;
        case 3: _t->showShaded(); break;
        case 4: _t->d_func()->_q_updateStaysOnTopHint(); break;
        case 5: _t->d_func()->_q_enterInteractiveMode(); break;
        case 6: _t->d_func()->_q_processFocusChanged((*reinterpret_cast< std::add_pointer_t<QWidget*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QWidget*>>(_a[2]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 6:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 1:
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QWidget* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QMdiSubWindow::*)(Qt::WindowStates , Qt::WindowStates )>(_a, &QMdiSubWindow::windowStateChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QMdiSubWindow::*)()>(_a, &QMdiSubWindow::aboutToActivate, 1))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->keyboardSingleStep(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->keyboardPageStep(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setKeyboardSingleStep(*reinterpret_cast<int*>(_v)); break;
        case 1: _t->setKeyboardPageStep(*reinterpret_cast<int*>(_v)); break;
        default: break;
        }
    }
}